

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O3

int h264_slice_data(bitstream *str,h264_slice *slice)

{
  vs_dir vVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  h264_cabac_context *cabac;
  ulong uVar7;
  int iVar8;
  h264_macroblock *phVar9;
  h264_macroblock *phVar10;
  bool bVar11;
  uint32_t mb_skip_flag;
  uint32_t end_of_slice_flag;
  uint32_t local_40;
  uint32_t local_3c;
  uint local_38;
  uint32_t local_34;
  
  slice->prev_mb_addr = 0xffffffff;
  uVar2 = (slice->mbaff_frame_flag + 1) * slice->first_mb_in_slice;
  slice->curr_mb_addr = uVar2;
  if (str->dir == VS_DECODE) {
    slice->last_mb_in_slice = uVar2;
  }
  uVar2 = 0x20;
  if (slice->slice_type == 1) {
    uVar2 = 0x38;
  }
  if (slice->picparm->entropy_coding_mode_flag == 0) {
    do {
      local_40 = 0;
      if ((slice->slice_type == 2) || (slice->slice_type == 4)) {
LAB_001075a8:
        uVar6 = slice->curr_mb_addr;
        if (slice->pic_size_in_mbs <= uVar6) goto LAB_00107738;
        if (slice->mbaff_frame_flag == 0) {
          phVar9 = slice->mbs + uVar6;
          uVar4 = slice->field_pic_flag;
LAB_0010763d:
          iVar3 = vs_infer(str,&phVar9->mb_field_decoding_flag,uVar4);
        }
        else {
          uVar5 = uVar6 & 0xfffffffe;
          phVar10 = slice->mbs;
          if (uVar6 != uVar5) {
            if (phVar10[uVar5].mb_type == uVar2) {
              iVar3 = h264_mb_field_decoding_flag
                                (str,(h264_cabac_context *)0x0,
                                 &phVar10[uVar5].mb_field_decoding_flag);
              if (iVar3 != 0) {
                return 1;
              }
              phVar10 = slice->mbs;
            }
            phVar9 = phVar10 + (uVar6 | 1);
            uVar4 = phVar10[uVar5].mb_field_decoding_flag;
            goto LAB_0010763d;
          }
          iVar3 = h264_mb_field_decoding_flag
                            (str,(h264_cabac_context *)0x0,&phVar10[uVar6].mb_field_decoding_flag);
        }
        if (iVar3 != 0) {
          return 1;
        }
        iVar3 = h264_macroblock_layer
                          (str,(h264_cabac_context *)0x0,slice,slice->mbs + slice->curr_mb_addr);
        if (iVar3 != 0) {
          return 1;
        }
        if (str->dir == VS_ENCODE) {
          uVar4 = slice->curr_mb_addr;
          if (slice->last_mb_in_slice == uVar4) goto LAB_001076fd;
          slice->prev_mb_addr = uVar4;
        }
        else {
          slice->last_mb_in_slice = slice->curr_mb_addr;
          iVar3 = vs_has_more_data(str);
          if (iVar3 == -1) {
            return 1;
          }
          if (iVar3 == 0) goto LAB_001076fd;
          uVar4 = slice->curr_mb_addr;
          vVar1 = str->dir;
          slice->prev_mb_addr = uVar4;
          if (vVar1 == VS_DECODE) {
            slice->last_mb_in_slice = uVar4;
          }
        }
        uVar4 = h264_next_mb_addr(slice,uVar4);
        slice->curr_mb_addr = uVar4;
        iVar8 = 0;
        if (slice->pic_size_in_mbs <= uVar4) {
LAB_00107738:
          h264_slice_data_cold_2();
          return 1;
        }
      }
      else {
        if (str->dir != VS_ENCODE) {
          iVar3 = vs_ue(str,&local_40);
          if (iVar3 != 0) {
            return 1;
          }
          bVar11 = local_40 != 0;
          local_40 = local_40 - 1;
          if (bVar11) {
            uVar6 = slice->curr_mb_addr;
            do {
              if (slice->pic_size_in_mbs <= uVar6) goto LAB_00107738;
              slice->last_mb_in_slice = uVar6;
              phVar9 = slice->mbs;
              phVar9[uVar6].mb_type = uVar2;
              iVar3 = infer_skip(str,slice,phVar9 + uVar6);
              if (iVar3 != 0) {
                return 1;
              }
              uVar4 = slice->curr_mb_addr;
              slice->prev_mb_addr = uVar4;
              slice->last_mb_in_slice = uVar4;
              uVar6 = h264_next_mb_addr(slice,uVar4);
              slice->curr_mb_addr = uVar6;
              bVar11 = local_40 != 0;
              local_40 = local_40 - 1;
            } while (bVar11);
          }
          iVar3 = vs_has_more_data(str);
          if (iVar3 == -1) {
            return 1;
          }
          if (iVar3 != 0) goto LAB_001075a8;
          goto LAB_001076fd;
        }
        phVar9 = slice->mbs;
        uVar7 = (ulong)slice->curr_mb_addr;
        if (phVar9[uVar7].mb_type == uVar2) {
          do {
            local_40 = local_40 + 1;
            iVar3 = infer_skip(str,slice,phVar9 + uVar7);
            if (iVar3 != 0) {
              return 1;
            }
            uVar4 = slice->curr_mb_addr;
            bVar11 = uVar4 == slice->last_mb_in_slice;
            if (bVar11) break;
            slice->prev_mb_addr = uVar4;
            uVar4 = h264_next_mb_addr(slice,uVar4);
            slice->curr_mb_addr = uVar4;
            phVar9 = slice->mbs;
            uVar7 = (ulong)uVar4;
          } while (phVar9[uVar7].mb_type == uVar2);
        }
        else {
          bVar11 = false;
        }
        iVar3 = vs_ue(str,&local_40);
        iVar8 = 8;
        if (iVar3 != 0) {
          iVar8 = 1;
        }
        if (iVar3 == 0 && !bVar11) goto LAB_001075a8;
      }
    } while (iVar8 == 0);
    if (iVar8 == 8) {
LAB_001076fd:
      iVar3 = vs_end(str);
      return (uint)(iVar3 != 0);
    }
  }
  else {
    iVar3 = vs_align_byte(str,VS_ALIGN_1);
    if (iVar3 == 0) {
      cabac = h264_cabac_new(slice);
      iVar3 = h264_cabac_init_arith(str,cabac);
      if (iVar3 == 0) {
        do {
          local_3c = 0;
          if ((slice->slice_type == 2) || (slice->slice_type == 4)) {
LAB_00107357:
            if (slice->mbaff_frame_flag == 0) {
              phVar9 = slice->mbs + slice->curr_mb_addr;
              uVar4 = slice->field_pic_flag;
LAB_001073e9:
              iVar3 = vs_infer(str,&phVar9->mb_field_decoding_flag,uVar4);
            }
            else {
              uVar6 = slice->curr_mb_addr;
              uVar5 = uVar6 & 0xfffffffe;
              phVar10 = slice->mbs;
              if (uVar6 != uVar5) {
                if (phVar10[uVar5].mb_type == uVar2) {
                  iVar3 = h264_mb_field_decoding_flag
                                    (str,cabac,&phVar10[uVar5].mb_field_decoding_flag);
                  if (iVar3 != 0) goto LAB_001071e0;
                  phVar10 = slice->mbs;
                }
                phVar9 = phVar10 + (uVar6 | 1);
                uVar4 = phVar10[uVar5].mb_field_decoding_flag;
                goto LAB_001073e9;
              }
              iVar3 = h264_mb_field_decoding_flag(str,cabac,&phVar10[uVar6].mb_field_decoding_flag);
            }
            if (iVar3 != 0) goto LAB_001071e0;
            iVar3 = h264_macroblock_layer(str,cabac,slice,slice->mbs + slice->curr_mb_addr);
          }
          else {
            phVar9 = slice->mbs;
            uVar6 = slice->curr_mb_addr;
            if (str->dir == VS_ENCODE) {
              local_3c = (uint32_t)(phVar9[uVar6].mb_type == uVar2);
            }
            local_34 = phVar9[uVar6].mb_field_decoding_flag;
            if ((((uVar6 & 1) == 0) || (slice->mbaff_frame_flag == 0)) ||
               (phVar9[uVar6 - 1].mb_type == uVar2)) {
              uVar4 = inferred_mb_field_decoding_flag(slice);
            }
            else {
              uVar4 = phVar9[uVar6 - 1].mb_field_decoding_flag;
            }
            phVar9[uVar6].mb_field_decoding_flag = uVar4;
            iVar3 = h264_mb_skip_flag(str,cabac,&local_3c);
            if (iVar3 != 0) goto LAB_001071e0;
            phVar9 = slice->mbs;
            uVar6 = slice->curr_mb_addr;
            phVar9[uVar6].mb_field_decoding_flag = local_34;
            if (local_3c == 0) goto LAB_00107357;
            iVar3 = infer_skip(str,slice,phVar9 + uVar6);
          }
          if (iVar3 != 0) goto LAB_001071e0;
          uVar6 = slice->curr_mb_addr;
          if (slice->mbaff_frame_flag == 0 || (uVar6 & 1) != 0) {
            local_38 = (uint)(slice->last_mb_in_slice == uVar6);
            iVar3 = h264_cabac_terminate(str,cabac,&local_38);
            if (iVar3 != 0) goto LAB_001071e0;
            if (local_38 != 0) {
              slice->last_mb_in_slice = slice->curr_mb_addr;
              h264_cabac_destroy(cabac);
              iVar3 = vs_align_byte(str,VS_ALIGN_0);
              return iVar3;
            }
            uVar6 = slice->curr_mb_addr;
          }
          slice->prev_mb_addr = uVar6;
          if (str->dir == VS_DECODE) {
            slice->last_mb_in_slice = uVar6;
          }
          uVar4 = h264_next_mb_addr(slice,uVar6);
          slice->curr_mb_addr = uVar4;
        } while (uVar4 < slice->pic_size_in_mbs);
        h264_slice_data_cold_1();
      }
      else {
LAB_001071e0:
        h264_cabac_destroy(cabac);
      }
    }
  }
  return 1;
}

Assistant:

int h264_slice_data(struct bitstream *str, struct h264_slice *slice) {
	slice->prev_mb_addr = -1;
	slice->curr_mb_addr = slice->first_mb_in_slice * (1 + slice->mbaff_frame_flag);
	if (str->dir == VS_DECODE)
		slice->last_mb_in_slice = slice->curr_mb_addr;
	uint32_t skip_type = (slice->slice_type == H264_SLICE_TYPE_B ? H264_MB_TYPE_B_SKIP : H264_MB_TYPE_P_SKIP);
	if (slice->picparm->entropy_coding_mode_flag) {
		if (vs_align_byte(str, VS_ALIGN_1)) return 1;
		struct h264_cabac_context *cabac = h264_cabac_new(slice);
		if (h264_cabac_init_arith(str, cabac)) { h264_cabac_destroy(cabac); return 1; }
		while (1) {
			uint32_t mb_skip_flag = 0;
			if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
				if (str->dir == VS_ENCODE) {
					mb_skip_flag = slice->mbs[slice->curr_mb_addr].mb_type == skip_type;
				}
				/* mb_field_decoding_flag is decoded *after* mb_skip_flag in some circumstances, have to use an inferred value for CABAC prediction */
				int save = slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag;
				int ival;
				if (slice->mbaff_frame_flag
						&& slice->curr_mb_addr & 1
						&& slice->mbs[slice->curr_mb_addr - 1].mb_type != skip_type) {
					ival = slice->mbs[slice->curr_mb_addr - 1].mb_field_decoding_flag;
				} else {
					ival = inferred_mb_field_decoding_flag(slice);
				}
				slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag = ival;
				if (h264_mb_skip_flag(str, cabac, &mb_skip_flag)) { h264_cabac_destroy(cabac); return 1; }
				slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag = save;
			}
			if (mb_skip_flag) {
				if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) { h264_cabac_destroy(cabac); return 1; }
			} else {
				if (slice->mbaff_frame_flag) {
					uint32_t first_addr = slice->curr_mb_addr & ~1;
					if (slice->curr_mb_addr == first_addr) {
						if (h264_mb_field_decoding_flag(str, cabac, &slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
					} else {
						if (slice->mbs[first_addr].mb_type == skip_type) {
							if (h264_mb_field_decoding_flag(str, cabac, &slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
						}
						if (vs_infer(str, &slice->mbs[first_addr + 1].mb_field_decoding_flag, slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
					}
				} else {
					if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) { h264_cabac_destroy(cabac); return 1; }
				}
				if (h264_macroblock_layer(str, cabac, slice, &slice->mbs[slice->curr_mb_addr])) { h264_cabac_destroy(cabac); return 1; }
			}
			if (!slice->mbaff_frame_flag || (slice->curr_mb_addr & 1)) {
				uint32_t end_of_slice_flag = slice->last_mb_in_slice == slice->curr_mb_addr;
				if (h264_cabac_terminate(str, cabac, &end_of_slice_flag)) { h264_cabac_destroy(cabac); return 1; }
				if (end_of_slice_flag) {
					slice->last_mb_in_slice = slice->curr_mb_addr;
					h264_cabac_destroy(cabac);
					/* XXX: cabac_zero_word crap */
					return vs_align_byte(str, VS_ALIGN_0);
				}
			}
			slice->prev_mb_addr = slice->curr_mb_addr;
			if (str->dir == VS_DECODE)
				slice->last_mb_in_slice = slice->curr_mb_addr;
			slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
		}
	} else {
		while (1) {
			int end = 0;
			uint32_t mb_skip_run = 0;
			if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
				if (str->dir == VS_ENCODE) {
					mb_skip_run = 0;
					while (slice->mbs[slice->curr_mb_addr].mb_type == skip_type) {
						mb_skip_run++;
						if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
						if (slice->curr_mb_addr == slice->last_mb_in_slice) {
							end = 1;
							break;
						}
						slice->prev_mb_addr = slice->curr_mb_addr;
						slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
					}
					if (vs_ue(str, &mb_skip_run)) return 1;
					if (end)
						goto out_cavlc;
				} else {
					if (vs_ue(str, &mb_skip_run)) return 1;
					while (mb_skip_run--) {
						if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
							fprintf(stderr, "MB index out of range!\n");
							return 1;
						}
						slice->last_mb_in_slice = slice->curr_mb_addr;
						slice->mbs[slice->curr_mb_addr].mb_type = skip_type;
						if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
						slice->prev_mb_addr = slice->curr_mb_addr;
						slice->last_mb_in_slice = slice->curr_mb_addr;
						slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
					}
					int more = vs_has_more_data(str);
					if (more == -1)
						return 1;
					if (more == 0)
						goto out_cavlc;
				}
			}
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
			if (slice->mbaff_frame_flag) {
				uint32_t first_addr = slice->curr_mb_addr & ~1;
				if (slice->curr_mb_addr == first_addr) {
					if (h264_mb_field_decoding_flag(str, 0, &slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
				} else {
					if (slice->mbs[first_addr].mb_type == skip_type)
						if (h264_mb_field_decoding_flag(str, 0, &slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
					if (vs_infer(str, &slice->mbs[first_addr + 1].mb_field_decoding_flag, slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
				}
			} else {
				if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) return 1;
			}
			if (h264_macroblock_layer(str, 0, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
			if(str->dir == VS_ENCODE) {
				if (slice->last_mb_in_slice == slice->curr_mb_addr)
					goto out_cavlc;
			} else {
				slice->last_mb_in_slice = slice->curr_mb_addr;
				int more = vs_has_more_data(str);
				if (more == -1)
					return 1;
				if (more == 0)
					goto out_cavlc;
			}
			slice->prev_mb_addr = slice->curr_mb_addr;
			if (str->dir == VS_DECODE)
				slice->last_mb_in_slice = slice->curr_mb_addr;
			slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
		}
out_cavlc:
		if (vs_end(str)) return 1;
		return 0;
	}
}